

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

uint32_t __thiscall Cache::getId(Cache *this,uint32_t addr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint in_ESI;
  Cache *in_RDI;
  uint32_t mask;
  uint32_t idBits;
  uint32_t offsetBits;
  
  uVar1 = log2i(in_RDI,(in_RDI->policy).blockSize);
  uVar2 = log2i(in_RDI,(in_RDI->policy).blockNum / (in_RDI->policy).associativity);
  return in_ESI >> ((byte)uVar1 & 0x1f) & (1 << ((byte)uVar2 & 0x1f)) - 1U;
}

Assistant:

uint32_t Cache::getId(uint32_t addr) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  uint32_t mask = (1 << idBits) - 1;
  return (addr >> offsetBits) & mask;
}